

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  Allocator *pAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  void *pvVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  uint *puVar26;
  uint _w;
  void *pvVar27;
  ulong uVar28;
  void *pvVar29;
  long lVar30;
  int k;
  long lVar31;
  ulong uVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  undefined1 (*pauVar37) [64];
  uint *puVar38;
  void *pvVar39;
  void *pvVar40;
  int iVar41;
  int iVar42;
  void *pvVar43;
  long lVar44;
  uint uVar45;
  int iVar46;
  undefined1 (*pauVar47) [64];
  long lVar48;
  void *pvVar49;
  uint *puVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  int local_158;
  uint local_150;
  void *local_138;
  void *local_120;
  void *local_118;
  void *local_110;
  uint local_108;
  int local_100;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  uint local_90;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar1 = (this->super_Convolution1D).kernel_w;
  lVar31 = (long)(int)uVar1;
  uVar24 = (ulong)uVar1;
  uVar22 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar1;
  uVar45 = (this->super_Convolution1D).num_output;
  uVar32 = (ulong)(int)uVar45;
  uVar22 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) /
           (long)(int)uVar45;
  uVar10 = (uint)uVar22;
  uVar14 = uVar22 & 0xffffffff;
  uVar18 = uVar10;
  if ((long)uVar32 < 0x10) {
    if ((int)uVar45 < 8) {
      if ((int)uVar45 < 4) {
        if ((int)uVar45 < 2) {
          uVar15 = uVar45;
          if ((int)uVar10 < 0x10) {
            if ((int)uVar10 < 8) {
              if ((int)uVar10 < 4) {
                _w = uVar1;
                if (1 < (int)uVar10) {
                  _w = uVar1 * 2;
                  uVar18 = (uVar10 & 1) + 1;
                }
              }
              else {
                _w = uVar1 * 4;
                uVar18 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
              }
            }
            else {
              _w = uVar1 * 8;
              uVar18 = (uVar10 & 1) + 1 + ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0)
              ;
            }
          }
          else {
            _w = uVar1 << 4;
            uVar18 = (uVar10 & 1) + (int)(uVar14 >> 4) + (uint)((uVar10 >> 3 & 1) != 0) +
                     ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
          }
        }
        else {
          if ((int)uVar10 < 0x10) {
            if ((int)uVar10 < 8) {
              if ((int)uVar10 < 4) {
                if ((int)uVar10 < 2) {
                  _w = uVar1 * 2;
                }
                else {
                  _w = uVar1 * 4;
                  uVar18 = (uVar10 & 1) + 1;
                }
                uVar15 = (uVar45 & 1) + 1;
                goto LAB_005730cf;
              }
              uVar18 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
              _w = uVar1 * 8;
            }
            else {
              _w = uVar1 << 4;
              uVar18 = (uVar10 & 1) + 1 + ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0)
              ;
            }
          }
          else {
            _w = uVar1 << 5;
            uVar18 = (uVar10 & 1) + (int)(uVar14 >> 4) + (uint)((uVar10 >> 3 & 1) != 0) +
                     ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
          }
          uVar15 = (uVar45 & 1) + 1;
        }
      }
      else {
        if ((int)uVar10 < 0x10) {
          if ((int)uVar10 < 8) {
            if ((int)uVar10 < 4) {
              if ((int)uVar10 < 2) {
                _w = uVar1 * 4;
              }
              else {
                _w = uVar1 * 8;
                uVar18 = (uVar10 & 1) + 1;
              }
              uVar15 = (uVar45 & 1) + 1 + (uint)((uVar45 >> 1 & 1) != 0);
              goto LAB_005730cf;
            }
            _w = uVar1 << 4;
            uVar18 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
          }
          else {
            _w = uVar1 << 5;
            uVar18 = (uVar10 & 1) + 1 + ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar1 << 6;
          uVar18 = (uVar10 & 1) + (int)(uVar14 >> 4) + (uint)((uVar10 >> 3 & 1) != 0) +
                   ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
        }
        uVar15 = (uVar45 & 1) + 1 + (uint)((uVar45 >> 1 & 1) != 0);
      }
    }
    else {
      if ((int)uVar10 < 0x10) {
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            if ((int)uVar10 < 2) {
              _w = uVar1 * 8;
            }
            else {
              _w = uVar1 << 4;
              uVar18 = (uVar10 & 1) + 1;
            }
            uVar15 = (uVar45 & 1) + 1 + ((uint)(uVar32 >> 2) & 1) + (uint)((uVar45 >> 1 & 1) != 0);
            goto LAB_005730cf;
          }
          _w = uVar1 << 5;
          uVar18 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
        }
        else {
          _w = uVar1 << 6;
          uVar18 = (uVar10 & 1) + 1 + ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else {
        _w = uVar1 << 7;
        uVar18 = (uVar10 & 1) + (int)(uVar14 >> 4) + (uint)((uVar10 >> 3 & 1) != 0) +
                 ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
      }
      uVar15 = (uVar45 & 1) + 1 + ((uint)(uVar32 >> 2) & 1) + (uint)((uVar45 >> 1 & 1) != 0);
    }
  }
  else {
    if ((int)uVar10 < 0x10) {
      if ((int)uVar10 < 8) {
        if ((int)uVar10 < 4) {
          if ((int)uVar10 < 2) {
            _w = uVar1 << 4;
            uVar15 = (uVar45 & 1) + (uVar45 >> 4) + (uint)((uVar45 >> 3 & 1) != 0) +
                     (uVar45 >> 2 & 1) + (uint)((uVar45 >> 1 & 1) != 0);
          }
          else {
            _w = uVar1 << 5;
            uVar15 = (uVar45 & 1) + (uVar45 >> 4) + (uint)((uVar45 >> 3 & 1) != 0) +
                     (uVar45 >> 2 & 1) + (uint)((uVar45 >> 1 & 1) != 0);
            uVar18 = (uVar10 & 1) + 1;
          }
          goto LAB_005730cf;
        }
        _w = uVar1 << 6;
        uVar18 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
      }
      else {
        _w = uVar1 << 7;
        uVar18 = (uVar10 & 1) + 1 + ((uint)(uVar14 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
      }
    }
    else {
      _w = uVar1 << 8;
      uVar18 = (uVar10 & 1) + (int)(uVar14 >> 4) + (uint)((uVar10 >> 3 & 1) != 0) +
               ((uint)(uVar22 >> 2) & 1) + (uint)((uVar10 >> 1 & 1) != 0);
    }
    uVar15 = (uVar45 & 1) + ((uint)(uVar32 >> 4) & 0xfffffff) + (uint)((uVar45 >> 3 & 1) != 0) +
             (uVar45 >> 2 & 1) + (uint)((uVar45 >> 1 & 1) != 0);
  }
LAB_005730cf:
  Mat::create(&this->weight_data_tm,_w,uVar18,uVar15,4,(Allocator *)0x0);
  uVar22 = 0;
  if (0xf < (int)uVar45) {
    auVar55 = vpbroadcastd_avx512f();
    auVar55 = vpmulld_avx512f(auVar55,_DAT_006004c0);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    local_c8 = uVar1 * uVar10;
    iVar41 = local_c8 * 0xf;
    iVar46 = local_c8 * 0x10;
    lVar33 = (long)(int)(uVar1 << 4) * 4;
    iVar16 = local_c8 * 0xe;
    local_c4 = local_c8 * 0xd;
    local_c8 = local_c8 * 0xc;
    local_e0 = uVar1 * uVar10;
    local_cc = local_e0 * 0xb;
    local_d0 = local_e0 * 8;
    local_d4 = local_e0 * 7;
    local_d8 = local_e0 * 9;
    local_dc = local_e0 * 10;
    local_e0 = local_e0 * 6;
    iVar11 = uVar1 * uVar10;
    local_e4 = iVar11 * 5;
    local_e8 = iVar11 * 4;
    local_ec = iVar11 * 3;
    iVar11 = iVar11 * 2;
    lVar35 = lVar31 * 4;
    iVar20 = 0;
    uVar14 = 0;
    local_f0 = uVar10 * uVar1;
    do {
      pauVar47 = (undefined1 (*) [64])
                 ((uVar14 >> 4) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                 (long)(this->weight_data_tm).data);
      local_138 = (this->super_Convolution1D).weight_data.data;
      if ((int)uVar10 < 0x10) {
        local_138 = (void *)((long)(int)(uVar10 * uVar1 * (int)uVar14) * 4 + (long)local_138);
        uVar18 = 0;
      }
      else {
        pvVar27 = (void *)((long)iVar41 * 4 + (long)local_138);
        pvVar29 = (void *)((long)iVar16 * 4 + (long)local_138);
        pvVar40 = (void *)((long)local_c4 * 4 + (long)local_138);
        pvVar12 = (void *)((long)local_c8 * 4 + (long)local_138);
        pvVar17 = (void *)((long)local_cc * 4 + (long)local_138);
        pvVar21 = (void *)((long)local_dc * 4 + (long)local_138);
        pvVar49 = (void *)((long)local_d8 * 4 + (long)local_138);
        pvVar23 = (void *)((long)local_d0 * 4 + (long)local_138);
        pvVar25 = (void *)((long)local_d4 * 4 + (long)local_138);
        pvVar34 = (void *)((long)local_e0 * 4 + (long)local_138);
        local_110 = (void *)((long)local_e4 * 4 + (long)local_138);
        local_118 = (void *)((long)local_e8 * 4 + (long)local_138);
        local_120 = (void *)((long)local_ec * 4 + (long)local_138);
        pvVar43 = (void *)((long)iVar11 * 4 + (long)local_138);
        pvVar39 = (void *)((long)local_f0 * 4 + (long)local_138);
        local_138 = (void *)((long)iVar20 * 4 + (long)local_138);
        iVar42 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar13 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)local_138 + lVar13 * 5));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + lVar13 * 5));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar43 + lVar13 * 5));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)local_120 + lVar13 * 5));
              auVar59 = vgatherdps_avx512f(*(undefined4 *)((long)local_118 + lVar13 * 5));
              auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)local_110 + lVar13 * 5));
              auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + lVar13 * 5));
              auVar62 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar25 + lVar13 * 5));
              auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar23 + lVar13 * 5));
              auVar64 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar49 + lVar13 * 5));
              auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar21 + lVar13 * 5));
              auVar66 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar13 * 5));
              auVar67 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + lVar13 * 5));
              auVar68 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar40 + lVar13 * 5));
              vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar69 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar29 + lVar13 * 5));
              vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              auVar70 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + lVar13 * 5));
              auVar71 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklps_avx512f(auVar59,auVar60);
              auVar59 = vunpckhps_avx512f(auVar59,auVar60);
              auVar60 = vunpcklps_avx512f(auVar61,auVar62);
              auVar61 = vunpckhps_avx512f(auVar61,auVar62);
              auVar62 = vunpcklps_avx512f(auVar63,auVar64);
              auVar63 = vunpckhps_avx512f(auVar63,auVar64);
              auVar64 = vunpcklps_avx512f(auVar65,auVar66);
              auVar65 = vunpckhps_avx512f(auVar65,auVar66);
              auVar66 = vunpcklps_avx512f(auVar67,auVar68);
              auVar67 = vunpckhps_avx512f(auVar67,auVar68);
              auVar68 = vunpcklps_avx512f(auVar69,auVar70);
              auVar69 = vunpckhps_avx512f(auVar69,auVar70);
              auVar70 = vunpcklpd_avx512f(auVar71,auVar56);
              auVar56 = vunpckhpd_avx512f(auVar71,auVar56);
              auVar71 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
              auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
              auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
              auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
              auVar61 = vunpcklpd_avx512f(auVar62,auVar64);
              auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
              auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
              auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
              auVar65 = vunpcklpd_avx512f(auVar66,auVar68);
              auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
              auVar68 = vunpcklpd_avx512f(auVar67,auVar69);
              auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
              auVar69 = vshuff64x2_avx512f(auVar70,auVar57,0x88);
              auVar72 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
              auVar73 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
              auVar74 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
              auVar75 = vshuff64x2_avx512f(auVar71,auVar60,0x88);
              auVar76 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
              auVar77 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
              auVar78 = vshuff64x2_avx512f(auVar63,auVar67,0x88);
              auVar57 = vshuff64x2_avx512f(auVar70,auVar57,0xdd);
              auVar61 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
              auVar58 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
              auVar60 = vshuff64x2_avx512f(auVar71,auVar60,0xdd);
              auVar62 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
              auVar59 = vshuff64x2_avx512f(auVar63,auVar67,0xdd);
              auVar63 = vshuff64x2_avx512f(auVar69,auVar72,0x88);
              auVar64 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
              auVar65 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
              auVar66 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
              auVar67 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
              auVar68 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
              in_ZMM17 = vshuff64x2_avx512f(auVar60,auVar62,0x88);
              auVar70 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
              in_ZMM16 = vshuff64x2_avx512f(auVar69,auVar72,0xdd);
              auVar69 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
              auVar71 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
              auVar72 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
              in_ZMM3 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar60,auVar62,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
              *pauVar47 = auVar63;
              pauVar47[1] = auVar64;
              pauVar47[2] = auVar65;
              pauVar47[3] = auVar66;
              pauVar47[4] = auVar67;
              pauVar47[5] = auVar68;
              pauVar47[6] = in_ZMM17;
              pauVar47[7] = auVar70;
              pauVar47[8] = in_ZMM16;
              pauVar47[9] = auVar69;
              pauVar47[10] = auVar71;
              pauVar47[0xb] = auVar72;
              pauVar47[0xc] = in_ZMM4;
              pauVar47[0xd] = in_ZMM3;
              pauVar47[0xe] = auVar56;
              pauVar47[0xf] = auVar55;
              pauVar47 = pauVar47 + 0x10;
              lVar13 = lVar13 + 4;
            } while (uVar24 * 4 != lVar13);
          }
          local_138 = (void *)((long)local_138 + lVar33);
          iVar19 = iVar42 + 0x1f;
          pvVar27 = (void *)((long)pvVar27 + lVar33);
          pvVar29 = (void *)((long)pvVar29 + lVar33);
          pvVar40 = (void *)((long)pvVar40 + lVar33);
          pvVar12 = (void *)((long)pvVar12 + lVar33);
          pvVar17 = (void *)((long)pvVar17 + lVar33);
          pvVar21 = (void *)((long)pvVar21 + lVar33);
          pvVar49 = (void *)((long)pvVar49 + lVar33);
          pvVar23 = (void *)((long)pvVar23 + lVar33);
          pvVar25 = (void *)((long)pvVar25 + lVar33);
          pvVar34 = (void *)((long)pvVar34 + lVar33);
          local_110 = (void *)((long)local_110 + lVar33);
          local_118 = (void *)((long)local_118 + lVar33);
          local_120 = (void *)((long)local_120 + lVar33);
          pvVar43 = (void *)((long)pvVar43 + lVar33);
          pvVar39 = (void *)((long)pvVar39 + lVar33);
          uVar18 = uVar10 & 0xfffffff0;
          iVar42 = iVar42 + 0x10;
        } while (iVar19 < (int)uVar10);
      }
      uVar15 = uVar18 | 7;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar40 = local_138;
          do {
            pauVar37 = pauVar47;
            lVar13 = 0;
            pvVar12 = pvVar40;
            do {
              lVar44 = lVar13;
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + (long)pvVar40 * 4));
              *(undefined1 (*) [64])((long)*pauVar37 + lVar44) = auVar55;
              pvVar12 = (void *)((long)pvVar12 + lVar35);
              lVar13 = lVar44 + 0x40;
            } while ((int)(lVar44 + 0x40) != 0x200);
            uVar22 = uVar22 + 1;
            pvVar40 = (void *)((long)pvVar40 + 4);
            pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
        }
        local_138 = (void *)((long)local_138 + (long)(int)(uVar1 * 8) * 4);
        uVar15 = uVar18 + 0xf;
        uVar18 = uVar18 + 8;
      }
      uVar15 = uVar18 | 3;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar40 = local_138;
          do {
            pauVar37 = pauVar47;
            lVar13 = 0;
            pvVar12 = pvVar40;
            do {
              lVar44 = lVar13;
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + (long)pvVar40 * 4));
              *(undefined1 (*) [64])((long)*pauVar37 + lVar44) = auVar55;
              pvVar12 = (void *)((long)pvVar12 + lVar35);
              lVar13 = lVar44 + 0x40;
            } while ((int)(lVar44 + 0x40) != 0x100);
            uVar22 = uVar22 + 1;
            pvVar40 = (void *)((long)pvVar40 + 4);
            pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
        }
        local_138 = (void *)((long)local_138 + (long)(int)(uVar1 * 4) * 4);
        uVar15 = uVar18 + 7;
        uVar18 = uVar18 + 4;
      }
      uVar15 = uVar18 | 1;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar40 = local_138;
          do {
            pauVar37 = pauVar47;
            lVar13 = 0;
            pvVar12 = pvVar40;
            do {
              lVar44 = lVar13;
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + (long)pvVar40 * 4));
              *(undefined1 (*) [64])((long)*pauVar37 + lVar44) = auVar55;
              pvVar12 = (void *)((long)pvVar12 + lVar35);
              lVar13 = lVar44 + 0x40;
            } while ((int)(lVar44 + 0x40) == 0x40);
            uVar22 = uVar22 + 1;
            pvVar40 = (void *)((long)pvVar40 + 4);
            pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])(pauVar37[1] + lVar44);
        }
        local_138 = (void *)((long)local_138 + (long)(int)(uVar1 * 2) * 4);
        uVar15 = uVar18 + 3;
        uVar18 = uVar18 + 2;
      }
      if ((int)uVar18 < (int)uVar10) {
        do {
          pvVar40 = local_138;
          uVar22 = uVar24;
          if (0 < (int)uVar1) {
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar40 * 5));
              *pauVar47 = auVar55;
              pauVar47 = pauVar47 + 1;
              pvVar40 = (void *)((long)pvVar40 + 4);
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar10);
      }
      uVar22 = uVar14 + 0x10;
      uVar28 = uVar14 + 0x1f;
      iVar41 = iVar41 + iVar46;
      iVar16 = iVar16 + iVar46;
      local_c4 = local_c4 + iVar46;
      local_c8 = local_c8 + iVar46;
      local_cc = local_cc + iVar46;
      local_dc = local_dc + iVar46;
      local_d8 = local_d8 + iVar46;
      local_d0 = local_d0 + iVar46;
      local_d4 = local_d4 + iVar46;
      local_e0 = local_e0 + iVar46;
      local_e4 = local_e4 + iVar46;
      local_e8 = local_e8 + iVar46;
      local_ec = local_ec + iVar46;
      iVar11 = iVar11 + iVar46;
      local_f0 = local_f0 + iVar46;
      iVar20 = iVar20 + iVar46;
      uVar14 = uVar22;
    } while (uVar28 < uVar32);
  }
  uVar18 = (uint)uVar22;
  if ((int)(uVar18 | 7) < (int)uVar45) {
    auVar53 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxbd_avx512f(_DAT_005f1940);
    auVar53 = vpmulld_avx2(auVar53,auVar55._0_32_);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    auVar54 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar54,auVar53);
    local_90 = uVar10 & 0xfffffff0;
    iVar11 = uVar1 * uVar10;
    iVar42 = (uVar18 + 6) * iVar11;
    local_138._0_4_ = uVar1 * uVar10;
    iVar41 = (uVar18 + 4) * (int)local_138;
    iVar20 = (uVar18 + 3) * (int)local_138;
    local_138._0_4_ = (uVar18 + 2) * (int)local_138;
    local_110._0_4_ = (uVar18 + 1) * uVar1 * uVar10;
    local_118._0_4_ = uVar1 * uVar10 * uVar18;
    iVar46 = (uVar18 + 5) * iVar11;
    iVar16 = iVar11 * 8;
    local_120._0_4_ = iVar11 * (uVar18 | 7);
    lVar35 = (long)(int)(uVar1 << 4) * 4;
    uVar14 = uVar22 & 0xffffffff;
    do {
      pauVar47 = (undefined1 (*) [64])
                 ((ulong)(((uint)(uVar14 >> 4) & 0xfffffff) + (uint)(((uint)uVar14 >> 3 & 1) != 0))
                  * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                 (long)(this->weight_data_tm).data);
      pvVar40 = (this->super_Convolution1D).weight_data.data;
      if ((int)uVar10 < 0x10) {
        uVar18 = 0;
      }
      else {
        pvVar29 = (void *)((long)(int)(uint)local_120 * 4 + (long)pvVar40);
        pvVar23 = (void *)((long)iVar42 * 4 + (long)pvVar40);
        pvVar17 = (void *)((long)iVar46 * 4 + (long)pvVar40);
        pvVar21 = (void *)((long)iVar41 * 4 + (long)pvVar40);
        pvVar25 = (void *)((long)iVar20 * 4 + (long)pvVar40);
        pvVar27 = (void *)((long)(int)local_138 * 4 + (long)pvVar40);
        pvVar12 = (void *)((long)(int)local_110 * 4 + (long)pvVar40);
        pvVar40 = (void *)((long)(int)local_118 * 4 + (long)pvVar40);
        iVar11 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar33 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar40 + lVar33) * 5));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)((lVar33 + (long)pvVar12) * 5));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar27 + lVar33) * 5));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar25 + lVar33) * 5));
              auVar59 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar21 + lVar33) * 5));
              auVar60 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar17 + lVar33) * 5));
              auVar61 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar23 + lVar33) * 5));
              auVar62 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar29 + lVar33) * 5));
              auVar63 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklps_avx512f(auVar59,auVar60);
              auVar59 = vunpckhps_avx512f(auVar59,auVar60);
              auVar60 = vunpcklps_avx512f(auVar61,auVar62);
              auVar61 = vunpckhps_avx512f(auVar61,auVar62);
              auVar62 = vunpcklpd_avx512f(auVar63,auVar56);
              auVar56 = vunpckhpd_avx512f(auVar63,auVar56);
              auVar63 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
              auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
              auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
              auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
              auVar61 = vshuff64x2_avx512f(auVar62,auVar57,0x88);
              auVar64 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
              auVar65 = vshuff64x2_avx512f(auVar63,auVar60,0x88);
              auVar66 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
              auVar57 = vshuff64x2_avx512f(auVar62,auVar57,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
              auVar58 = vshuff64x2_avx512f(auVar63,auVar60,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
              auVar59 = vshuff64x2_avx512f(auVar61,auVar64,0x88);
              auVar60 = vshuff64x2_avx512f(auVar65,auVar66,0x88);
              auVar62 = vshuff64x2_avx512f(auVar57,auVar56,0x88);
              auVar63 = vshuff64x2_avx512f(auVar58,auVar55,0x88);
              auVar61 = vshuff64x2_avx512f(auVar61,auVar64,0xdd);
              auVar64 = vshuff64x2_avx512f(auVar65,auVar66,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar57,auVar56,0xdd);
              in_ZMM3 = vshuff64x2_avx512f(auVar58,auVar55,0xdd);
              *pauVar47 = auVar59;
              pauVar47[1] = auVar60;
              pauVar47[2] = auVar62;
              pauVar47[3] = auVar63;
              pauVar47[4] = auVar61;
              pauVar47[5] = auVar64;
              pauVar47[6] = in_ZMM4;
              pauVar47[7] = in_ZMM3;
              pauVar47 = pauVar47 + 8;
              lVar33 = lVar33 + 4;
            } while (uVar24 * 4 - lVar33 != 0);
          }
          pvVar40 = (void *)((long)pvVar40 + lVar35);
          pvVar12 = (void *)((long)pvVar12 + lVar35);
          pvVar27 = (void *)((long)pvVar27 + lVar35);
          pvVar25 = (void *)((long)pvVar25 + lVar35);
          pvVar21 = (void *)((long)pvVar21 + lVar35);
          pvVar17 = (void *)((long)pvVar17 + lVar35);
          pvVar23 = (void *)((long)pvVar23 + lVar35);
          pvVar29 = (void *)((long)pvVar29 + lVar35);
          iVar19 = iVar11 + 0x1f;
          iVar11 = iVar11 + 0x10;
          uVar18 = local_90;
        } while (iVar19 < (int)uVar10);
      }
      uVar15 = uVar18 | 7;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar33 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar54 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar79 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar80 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar81 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar82 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar83 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar84 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vunpcklps_avx(auVar54,auVar79);
            auVar54 = vunpckhps_avx(auVar54,auVar79);
            auVar5 = vunpcklps_avx(auVar80,auVar81);
            auVar79 = vunpckhps_avx(auVar80,auVar81);
            auVar6 = vunpcklps_avx(auVar82,auVar83);
            auVar80 = vunpckhps_avx(auVar82,auVar83);
            auVar85 = vunpcklps_avx(auVar84,auVar86);
            auVar81 = vunpckhps_avx(auVar84,auVar86);
            auVar82 = vunpcklpd_avx(auVar53,auVar5);
            auVar53 = vunpckhpd_avx(auVar53,auVar5);
            auVar5 = vunpcklpd_avx(auVar54,auVar79);
            auVar54 = vunpckhpd_avx(auVar54,auVar79);
            auVar83 = vunpcklpd_avx(auVar6,auVar85);
            auVar79 = vunpckhpd_avx(auVar6,auVar85);
            auVar6 = vunpcklpd_avx(auVar80,auVar81);
            auVar80 = vunpckhpd_avx(auVar80,auVar81);
            auVar85._16_16_ = auVar83._0_16_;
            auVar85._0_16_ = auVar82._0_16_;
            auVar84._16_16_ = auVar79._0_16_;
            auVar84._0_16_ = auVar53._0_16_;
            auVar86._16_16_ = auVar6._0_16_;
            auVar86._0_16_ = auVar5._0_16_;
            auVar87._16_16_ = auVar80._0_16_;
            auVar87._0_16_ = auVar54._0_16_;
            auVar81 = vperm2f128_avx(auVar82,auVar83,0x31);
            auVar53 = vperm2f128_avx(auVar53,auVar79,0x31);
            in_ZMM3 = ZEXT3264(auVar53);
            auVar79 = vperm2f128_avx(auVar5,auVar6,0x31);
            auVar54 = vperm2f128_avx(auVar54,auVar80,0x31);
            in_ZMM4 = ZEXT3264(auVar54);
            *(undefined1 (*) [32])*pauVar47 = auVar85;
            *(undefined1 (*) [32])((long)*pauVar47 + 0x20) = auVar84;
            *(undefined1 (*) [32])pauVar47[1] = auVar86;
            *(undefined1 (*) [32])(pauVar47[1] + 0x20) = auVar87;
            *(undefined1 (*) [32])pauVar47[2] = auVar81;
            *(undefined1 (*) [32])(pauVar47[2] + 0x20) = auVar53;
            *(undefined1 (*) [32])pauVar47[3] = auVar79;
            *(undefined1 (*) [32])(pauVar47[3] + 0x20) = auVar54;
            pauVar47 = pauVar47 + 4;
            lVar33 = lVar33 + 4;
          } while (uVar24 * 4 - lVar33 != 0);
        }
        uVar15 = uVar18 + 0xf;
        uVar18 = uVar18 + 8;
      }
      uVar15 = uVar18 | 3;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          do {
            pauVar37 = pauVar47;
            lVar33 = 0;
            do {
              auVar53 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
              in_ZMM4 = ZEXT3264(auVar53);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar37 + lVar33) = auVar53;
              lVar33 = lVar33 + 0x20;
            } while ((int)lVar33 != 0x80);
            uVar22 = uVar22 + 1;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
        }
        uVar15 = uVar18 + 7;
        uVar18 = uVar18 + 4;
      }
      uVar15 = uVar18 | 1;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          do {
            pauVar37 = pauVar47;
            lVar33 = 0;
            do {
              auVar53 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
              in_ZMM4 = ZEXT3264(auVar53);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar37 + lVar33) = auVar53;
              lVar33 = lVar33 + 0x20;
            } while ((int)lVar33 == 0x20);
            uVar22 = uVar22 + 1;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
        }
        uVar15 = uVar18 + 3;
        uVar18 = uVar18 + 2;
      }
      if ((int)uVar18 < (int)uVar10) {
        do {
          uVar22 = uVar24;
          if (0 < (int)uVar1) {
            do {
              auVar53 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
              in_ZMM4 = ZEXT3264(auVar53);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])*pauVar47 = auVar53;
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar10);
      }
      uVar22 = uVar14 + 8;
      lVar33 = uVar14 + 0xf;
      local_120._0_4_ = (uint)local_120 + iVar16;
      iVar42 = iVar42 + iVar16;
      iVar46 = iVar46 + iVar16;
      iVar41 = iVar41 + iVar16;
      iVar20 = iVar20 + iVar16;
      local_138._0_4_ = (int)local_138 + iVar16;
      local_110._0_4_ = (int)local_110 + iVar16;
      local_118._0_4_ = (int)local_118 + iVar16;
      uVar14 = uVar22;
    } while (lVar33 < (long)uVar32);
  }
  uVar18 = (uint)uVar22;
  if ((int)(uVar18 | 3) < (int)uVar45) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxbd_avx512f(_DAT_005f1940);
    auVar51 = vpmulld_avx(auVar51,auVar55._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar55._0_32_);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    lVar33 = (long)(int)(uVar1 * 8);
    auVar52 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar52,auVar51);
    local_120._0_4_ = uVar10 & 0xfffffff0;
    lVar35 = uVar24 * 4;
    iVar11 = uVar1 * uVar10;
    iVar16 = iVar11 * 4;
    iVar41 = (uVar18 + 2) * iVar11;
    local_100 = (uVar18 + 1) * iVar11;
    local_108 = iVar11 * (uVar18 | 3);
    lVar13 = (long)(int)(uVar1 << 4) * 4;
    iVar11 = uVar1 * uVar10 * uVar18;
    uVar14 = uVar22 & 0xffffffff;
    do {
      pvVar40 = (this->super_Convolution1D).weight_data.data;
      pauVar47 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)(((uint)(uVar14 >> 3) & 1) + ((uint)(uVar14 >> 4) & 0xfffffff) +
                         (uint)(((uint)uVar14 >> 2 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar10 < 0x10) {
        uVar18 = 0;
      }
      else {
        pvVar17 = (void *)((long)(int)local_108 * 4 + (long)pvVar40);
        pvVar12 = (void *)((long)iVar41 * 4 + (long)pvVar40);
        pvVar21 = (void *)((long)local_100 * 4 + (long)pvVar40);
        pvVar40 = (void *)((long)iVar11 * 4 + (long)pvVar40);
        iVar20 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar44 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar40 + lVar33 * 0x10 + lVar44));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar21 + lVar33 * 0x10 + lVar44));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + lVar33 * 0x10 + lVar44));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar33 * 0x10 + lVar44));
              auVar59 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklpd_avx512f(auVar59,auVar56);
              auVar56 = vunpckhpd_avx512f(auVar59,auVar56);
              auVar59 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vshuff64x2_avx512f(auVar58,auVar56,0x88);
              auVar60 = vshuff64x2_avx512f(auVar59,auVar55,0x88);
              auVar56 = vshuff64x2_avx512f(auVar58,auVar56,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar59,auVar55,0xdd);
              auVar58 = vshuff64x2_avx512f(auVar57,auVar60,0x88);
              auVar59 = vshuff64x2_avx512f(auVar56,auVar55,0x88);
              auVar57 = vshuff64x2_avx512f(auVar57,auVar60,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar56,auVar55,0xdd);
              *pauVar47 = auVar58;
              pauVar47[1] = auVar59;
              pauVar47[2] = auVar57;
              pauVar47[3] = in_ZMM4;
              pauVar47 = pauVar47 + 4;
              lVar44 = lVar44 + 4;
            } while (lVar35 - lVar44 != 0);
          }
          pvVar40 = (void *)((long)pvVar40 + lVar13);
          pvVar21 = (void *)((long)pvVar21 + lVar13);
          pvVar12 = (void *)((long)pvVar12 + lVar13);
          pvVar17 = (void *)((long)pvVar17 + lVar13);
          iVar46 = iVar20 + 0x1f;
          iVar20 = iVar20 + 0x10;
          uVar18 = (uint)local_120;
        } while (iVar46 < (int)uVar10);
      }
      uVar15 = uVar18 | 7;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar44 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar54 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar79 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar80 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar82 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vunpcklps_avx(auVar54,auVar79);
            auVar54 = vunpckhps_avx(auVar54,auVar79);
            auVar81 = vunpcklps_avx(auVar80,auVar82);
            auVar79 = vunpckhps_avx(auVar80,auVar82);
            auVar80 = vunpcklpd_avx(auVar53,auVar81);
            auVar53 = vunpckhpd_avx(auVar53,auVar81);
            auVar81 = vunpcklpd_avx(auVar54,auVar79);
            auVar54 = vunpckhpd_avx(auVar54,auVar79);
            auVar79._16_16_ = auVar53._0_16_;
            auVar79._0_16_ = auVar80._0_16_;
            auVar82._16_16_ = auVar54._0_16_;
            auVar82._0_16_ = auVar81._0_16_;
            auVar53 = vperm2f128_avx(auVar80,auVar53,0x31);
            in_ZMM4 = ZEXT3264(auVar53);
            auVar54 = vperm2f128_avx(auVar81,auVar54,0x31);
            *(undefined1 (*) [32])*pauVar47 = auVar79;
            *(undefined1 (*) [32])((long)*pauVar47 + 0x20) = auVar82;
            *(undefined1 (*) [32])pauVar47[1] = auVar53;
            *(undefined1 (*) [32])(pauVar47[1] + 0x20) = auVar54;
            pauVar47 = pauVar47 + 2;
            lVar44 = lVar44 + 4;
          } while (lVar35 - lVar44 != 0);
        }
        uVar15 = uVar18 + 0xf;
        uVar18 = uVar18 + 8;
      }
      uVar15 = uVar18 | 3;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar44 = 0;
          do {
            auVar51 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar7 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar8 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar9 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar52 = vunpcklps_avx(auVar7,auVar8);
            auVar4 = vunpcklps_avx(auVar9,auVar51);
            auVar7 = vunpckhps_avx(auVar7,auVar8);
            auVar8 = vunpckhps_avx(auVar9,auVar51);
            auVar51 = vmovlhps_avx(auVar52,auVar4);
            auVar4 = vunpckhpd_avx(auVar52,auVar4);
            in_ZMM4 = ZEXT1664(auVar4);
            auVar52 = vmovlhps_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            *(undefined1 (*) [16])*pauVar47 = auVar51;
            *(undefined1 (*) [16])((long)*pauVar47 + 0x10) = auVar4;
            *(undefined1 (*) [16])((long)*pauVar47 + 0x20) = auVar52;
            *(undefined1 (*) [16])((long)*pauVar47 + 0x30) = auVar7;
            pauVar47 = pauVar47 + 1;
            lVar44 = lVar44 + 4;
          } while (lVar35 - lVar44 != 0);
        }
        uVar15 = uVar18 + 7;
        uVar18 = uVar18 + 4;
      }
      uVar15 = uVar18 | 1;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          do {
            pauVar37 = pauVar47;
            lVar44 = 0;
            do {
              auVar51 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
              in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])((long)*pauVar37 + lVar44) = auVar51;
              lVar44 = lVar44 + 0x10;
            } while ((int)lVar44 == 0x10);
            uVar22 = uVar22 + 1;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar44);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar44);
        }
        uVar15 = uVar18 + 3;
        uVar18 = uVar18 + 2;
      }
      if ((int)uVar18 < (int)uVar10) {
        do {
          uVar22 = uVar24;
          if (0 < (int)uVar1) {
            do {
              auVar51 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
              in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])*pauVar47 = auVar51;
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar10);
      }
      uVar22 = uVar14 + 4;
      lVar44 = uVar14 + 7;
      local_108 = local_108 + iVar16;
      iVar41 = iVar41 + iVar16;
      local_100 = local_100 + iVar16;
      iVar11 = iVar11 + iVar16;
      uVar14 = uVar22;
    } while (lVar44 < (long)uVar32);
  }
  uVar15 = (uint)uVar22;
  uVar18 = uVar15 | 1;
  if ((int)uVar18 < (int)uVar45) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar56 = vpmovsxbd_avx512f(_DAT_005f1940);
    vpmulld_avx(auVar51,auVar56._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar56._0_32_);
    auVar55 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar55,auVar56);
    lVar13 = (long)(int)(uVar1 * 8);
    local_108 = uVar10 & 0xfffffff0;
    lVar35 = uVar24 * 4;
    local_158 = uVar1 * uVar10 * uVar18;
    iVar16 = uVar1 * uVar10 * 2;
    lVar33 = (long)(int)(uVar1 << 4) * 4;
    local_150 = uVar1 * uVar10 * uVar15;
    lVar44 = (long)(int)(uVar1 * 4) * 4;
    lVar30 = (long)(int)(uVar1 * 2) * 4;
    uVar14 = (long)(int)uVar15;
    do {
      uVar15 = (uint)uVar14;
      pvVar40 = (this->super_Convolution1D).weight_data.data;
      pauVar47 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)(((uint)(uVar14 >> 2) & 1) +
                          ((uint)(uVar14 >> 4) & 0xfffffff) + (uint)((uVar15 >> 3 & 1) != 0) +
                         (uint)((uVar15 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar10 < 0x10) {
        pvVar12 = (void *)((long)pvVar40 + (long)(int)(uVar10 * uVar1 * uVar15) * 4);
        pvVar17 = (void *)((long)pvVar40 + (long)(int)(uVar18 * uVar10 * uVar1) * 4);
        uVar18 = 0;
      }
      else {
        pvVar17 = (void *)((long)local_158 * 4 + (long)pvVar40);
        pvVar12 = (void *)((long)(int)local_150 * 4 + (long)pvVar40);
        iVar11 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar36 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar12 + lVar13 * 0x10 + lVar36));
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar13 * 0x10 + lVar36));
              *pauVar47 = auVar55;
              pauVar47[1] = in_ZMM4;
              pauVar47 = pauVar47 + 2;
              lVar36 = lVar36 + 4;
            } while (lVar35 - lVar36 != 0);
          }
          pvVar12 = (void *)((long)pvVar12 + lVar33);
          pvVar17 = (void *)((long)pvVar17 + lVar33);
          iVar41 = iVar11 + 0x1f;
          iVar11 = iVar11 + 0x10;
          uVar18 = local_108;
        } while (iVar41 < (int)uVar10);
      }
      uVar15 = uVar18 | 7;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar36 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(auVar55._0_32_,auVar55._0_32_);
            auVar54 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            in_ZMM4 = ZEXT3264(auVar54);
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar55 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar47 = auVar54;
            *(undefined1 (*) [32])((long)*pauVar47 + 0x20) = auVar53;
            pauVar47 = pauVar47 + 1;
            lVar36 = lVar36 + 4;
          } while (lVar35 - lVar36 != 0);
        }
        pvVar12 = (void *)((long)pvVar12 + lVar13 * 4);
        pvVar17 = (void *)((long)pvVar17 + lVar13 * 4);
        uVar15 = uVar18 + 0xf;
        uVar18 = uVar18 + 8;
      }
      uVar15 = uVar18 | 3;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar36 = 0;
          do {
            auVar51 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
            auVar52 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            in_ZMM4 = ZEXT1664(auVar52);
            auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar47 = auVar52;
            *(undefined1 (*) [16])((long)*pauVar47 + 0x10) = auVar51;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            lVar36 = lVar36 + 4;
          } while (lVar35 - lVar36 != 0);
        }
        pvVar12 = (void *)((long)pvVar12 + lVar44);
        pvVar17 = (void *)((long)pvVar17 + lVar44);
        uVar15 = uVar18 + 7;
        uVar18 = uVar18 + 4;
      }
      uVar15 = uVar18 | 1;
      while ((int)uVar15 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar40 = pvVar12;
          pvVar21 = pvVar17;
          do {
            pauVar37 = pauVar47;
            lVar48 = 0;
            lVar36 = 0;
            do {
              *(undefined4 *)((long)*pauVar37 + lVar36) = *(undefined4 *)((long)pvVar40 + lVar48);
              auVar55 = ZEXT464(*(uint *)((long)pvVar21 + lVar48));
              *(uint *)((long)*pauVar37 + lVar36 + 4) = *(uint *)((long)pvVar21 + lVar48);
              lVar36 = lVar36 + 8;
              lVar48 = lVar48 + lVar31 * 4;
            } while ((int)lVar36 == 8);
            uVar22 = uVar22 + 1;
            pvVar21 = (void *)((long)pvVar21 + 4);
            pvVar40 = (void *)((long)pvVar40 + 4);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar36);
          } while (uVar22 != uVar24);
          pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar36);
        }
        pvVar12 = (void *)((long)pvVar12 + lVar30);
        pvVar17 = (void *)((long)pvVar17 + lVar30);
        uVar15 = uVar18 + 3;
        uVar18 = uVar18 + 2;
      }
      if ((int)uVar18 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              *(undefined4 *)*pauVar47 = *(undefined4 *)((long)pvVar12 + uVar22 * 4);
              uVar15 = *(uint *)((long)pvVar17 + uVar22 * 4);
              auVar55 = ZEXT464(uVar15);
              *(uint *)((long)*pauVar47 + 4) = uVar15;
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 8);
              uVar22 = uVar22 + 1;
            } while (uVar24 != uVar22);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar10);
      }
      uVar22 = uVar14 + 2;
      lVar36 = uVar14 + 3;
      uVar18 = (uint)lVar36;
      local_158 = local_158 + iVar16;
      local_150 = local_150 + iVar16;
      uVar14 = uVar22;
    } while (lVar36 < (long)uVar32);
  }
  iVar16 = (int)uVar22;
  if (iVar16 < (int)uVar45) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar56 = vpmovsxbd_avx512f(_DAT_005f1940);
    vpmulld_avx(auVar51,auVar56._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar56._0_32_);
    auVar55 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar55,auVar56);
    local_150 = uVar10 & 0xfffffff0;
    uVar22 = (ulong)iVar16;
    lVar35 = uVar24 * 4;
    iVar16 = uVar1 * uVar10 * iVar16;
    do {
      uVar45 = (uint)uVar22;
      pvVar40 = (this->super_Convolution1D).weight_data.data;
      pauVar47 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)((uVar45 & 1) + ((uint)(uVar22 >> 4) & 0xfffffff) +
                          (uint)((uVar45 >> 3 & 1) != 0) + ((uint)(uVar22 >> 2) & 1) +
                         (uint)((uVar45 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar10 < 0x10) {
        puVar50 = (uint *)((long)pvVar40 + (long)(int)(uVar10 * uVar1 * uVar45) * 4);
        uVar45 = 0;
      }
      else {
        puVar50 = (uint *)((long)pvVar40 + (long)iVar16 * 4);
        iVar11 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar33 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)puVar50 + (long)(int)(uVar1 * 8) * 0x10 + lVar33)
                                          );
              *pauVar47 = auVar55;
              pauVar47 = pauVar47 + 1;
              lVar33 = lVar33 + 4;
            } while (lVar35 - lVar33 != 0);
          }
          puVar50 = puVar50 + (int)(uVar1 << 4);
          iVar41 = iVar11 + 0x1f;
          iVar11 = iVar11 + 0x10;
          uVar45 = local_150;
        } while (iVar41 < (int)uVar10);
      }
      uVar18 = uVar45 | 7;
      while ((int)uVar18 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar33 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar53 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
            auVar55 = ZEXT3264(auVar53);
            in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar47 = auVar53;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
            lVar33 = lVar33 + 4;
          } while (lVar35 - lVar33 != 0);
        }
        puVar50 = puVar50 + (int)(uVar1 * 8);
        uVar18 = uVar45 + 0xf;
        uVar45 = uVar45 + 8;
      }
      uVar18 = uVar45 | 3;
      while ((int)uVar18 < (int)uVar10) {
        if (0 < (int)uVar1) {
          lVar33 = 0;
          do {
            auVar51 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
            auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            in_ZMM4 = ZEXT1664(auVar51);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar47 = auVar51;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
            lVar33 = lVar33 + 4;
          } while (lVar35 - lVar33 != 0);
        }
        puVar50 = puVar50 + (int)(uVar1 * 4);
        uVar18 = uVar45 + 7;
        uVar45 = uVar45 + 4;
      }
      uVar18 = uVar45 | 1;
      while ((int)uVar18 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar14 = 0;
          puVar26 = puVar50;
          do {
            pauVar37 = pauVar47;
            lVar33 = 0;
            puVar38 = puVar26;
            do {
              auVar55 = ZEXT464(*puVar38);
              *(uint *)((long)*pauVar37 + lVar33) = *puVar38;
              lVar33 = lVar33 + 4;
              puVar38 = puVar38 + lVar31;
            } while ((int)lVar33 == 4);
            uVar14 = uVar14 + 1;
            puVar26 = puVar26 + 1;
            pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
          } while (uVar14 != uVar24);
          pauVar47 = (undefined1 (*) [64])((long)*pauVar37 + lVar33);
        }
        puVar50 = puVar50 + (int)(uVar1 * 2);
        uVar18 = uVar45 + 3;
        uVar45 = uVar45 + 2;
      }
      if ((int)uVar45 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            lVar33 = 0;
            do {
              auVar55 = ZEXT464(*(uint *)((long)puVar50 + lVar33));
              *(uint *)((long)*pauVar47 + lVar33) = *(uint *)((long)puVar50 + lVar33);
              lVar33 = lVar33 + 4;
            } while (lVar35 - lVar33 != 0);
            pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + lVar33);
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar10);
      }
      uVar22 = uVar22 + 1;
      iVar16 = iVar16 + uVar1 * uVar10;
    } while (uVar22 != uVar32);
  }
  if (opt->lightmode == true) {
    piVar2 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar40 = (this->super_Convolution1D).weight_data.data;
        pAVar3 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar40 != (void *)0x0) {
            free(pvVar40);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}